

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_query.c
# Opt level: O0

void ares_query_dnsrec_cb(void *arg,ares_status_t status,size_t timeouts,ares_dns_record_t *dnsrec)

{
  ares_dns_rcode_t rcode_00;
  ares_status_t aVar1;
  size_t ancount_00;
  ares_dns_rcode_t rcode;
  size_t ancount;
  ares_query_dnsrec_arg_t *qquery;
  ares_dns_record_t *dnsrec_local;
  size_t timeouts_local;
  ares_status_t status_local;
  void *arg_local;
  
  if (status == ARES_SUCCESS) {
    rcode_00 = ares_dns_record_get_rcode(dnsrec);
    ancount_00 = ares_dns_record_rr_cnt(dnsrec,ARES_SECTION_ANSWER);
    aVar1 = ares_dns_query_reply_tostatus(rcode_00,ancount_00);
    (**arg)(*(undefined8 *)((long)arg + 8),aVar1,timeouts,dnsrec);
  }
  else {
    (**arg)(*(undefined8 *)((long)arg + 8),status,timeouts,dnsrec);
  }
  ares_free(arg);
  return;
}

Assistant:

static void ares_query_dnsrec_cb(void *arg, ares_status_t status,
                                 size_t                   timeouts,
                                 const ares_dns_record_t *dnsrec)
{
  ares_query_dnsrec_arg_t *qquery = arg;

  if (status != ARES_SUCCESS) {
    qquery->callback(qquery->arg, status, timeouts, dnsrec);
  } else {
    size_t           ancount;
    ares_dns_rcode_t rcode;
    /* Pull the response code and answer count from the packet and convert any
     * errors.
     */
    rcode   = ares_dns_record_get_rcode(dnsrec);
    ancount = ares_dns_record_rr_cnt(dnsrec, ARES_SECTION_ANSWER);
    status  = ares_dns_query_reply_tostatus(rcode, ancount);
    qquery->callback(qquery->arg, status, timeouts, dnsrec);
  }
  ares_free(qquery);
}